

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_tools.h
# Opt level: O0

double math::matrix_determinant<double>(Matrix<double,_3,_3> *m)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double *pdVar18;
  Matrix<double,_3,_3> *m_local;
  
  pdVar18 = Matrix<double,_3,_3>::operator[](m,0);
  dVar1 = *pdVar18;
  pdVar18 = Matrix<double,_3,_3>::operator[](m,4);
  dVar2 = *pdVar18;
  pdVar18 = Matrix<double,_3,_3>::operator[](m,8);
  dVar3 = *pdVar18;
  pdVar18 = Matrix<double,_3,_3>::operator[](m,1);
  dVar4 = *pdVar18;
  pdVar18 = Matrix<double,_3,_3>::operator[](m,5);
  dVar5 = *pdVar18;
  pdVar18 = Matrix<double,_3,_3>::operator[](m,6);
  dVar6 = *pdVar18;
  pdVar18 = Matrix<double,_3,_3>::operator[](m,2);
  dVar7 = *pdVar18;
  pdVar18 = Matrix<double,_3,_3>::operator[](m,3);
  dVar8 = *pdVar18;
  pdVar18 = Matrix<double,_3,_3>::operator[](m,7);
  dVar9 = *pdVar18;
  pdVar18 = Matrix<double,_3,_3>::operator[](m,2);
  dVar10 = *pdVar18;
  pdVar18 = Matrix<double,_3,_3>::operator[](m,4);
  dVar11 = *pdVar18;
  pdVar18 = Matrix<double,_3,_3>::operator[](m,6);
  dVar12 = *pdVar18;
  pdVar18 = Matrix<double,_3,_3>::operator[](m,1);
  dVar13 = *pdVar18;
  pdVar18 = Matrix<double,_3,_3>::operator[](m,3);
  dVar14 = *pdVar18;
  pdVar18 = Matrix<double,_3,_3>::operator[](m,8);
  dVar15 = *pdVar18;
  pdVar18 = Matrix<double,_3,_3>::operator[](m,0);
  dVar16 = *pdVar18;
  pdVar18 = Matrix<double,_3,_3>::operator[](m,5);
  dVar17 = *pdVar18;
  pdVar18 = Matrix<double,_3,_3>::operator[](m,7);
  return -(dVar16 * dVar17) * *pdVar18 +
         -(dVar13 * dVar14) * dVar15 +
         -(dVar10 * dVar11) * dVar12 +
         dVar7 * dVar8 * dVar9 + dVar1 * dVar2 * dVar3 + dVar4 * dVar5 * dVar6;
}

Assistant:

inline T
matrix_determinant (Matrix<T,3,3> const& m)
{
    return m[0] * m[4] * m[8] + m[1] * m[5] * m[6] + m[2] * m[3] * m[7]
         - m[2] * m[4] * m[6] - m[1] * m[3] * m[8] - m[0] * m[5] * m[7];
}